

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msa_helper.c
# Opt level: O2

void helper_msa_min_a_b_mips64(CPUMIPSState_conflict5 *env,uint32_t wd,uint32_t ws,uint32_t wt)

{
  fpr_t *pfVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  byte bVar5;
  byte bVar6;
  byte bVar7;
  byte bVar8;
  byte bVar9;
  byte bVar10;
  byte bVar11;
  byte bVar12;
  byte bVar13;
  byte bVar14;
  byte bVar15;
  byte bVar16;
  byte bVar17;
  byte bVar18;
  byte bVar19;
  byte bVar20;
  byte bVar21;
  byte bVar22;
  byte bVar23;
  byte bVar24;
  byte bVar25;
  byte bVar26;
  byte bVar27;
  byte bVar28;
  byte bVar29;
  byte bVar30;
  byte bVar31;
  byte bVar32;
  byte bVar33;
  byte bVar34;
  byte bVar35;
  byte bVar36;
  byte bVar37;
  byte bVar38;
  byte bVar39;
  byte bVar40;
  byte bVar41;
  byte bVar42;
  byte bVar43;
  byte bVar44;
  byte bVar45;
  byte bVar46;
  byte bVar47;
  byte bVar48;
  byte bVar49;
  byte bVar50;
  byte bVar51;
  byte bVar52;
  byte bVar53;
  byte bVar54;
  byte bVar55;
  byte bVar56;
  byte bVar57;
  byte bVar58;
  byte bVar59;
  byte bVar60;
  byte bVar61;
  byte bVar62;
  byte bVar63;
  byte bVar64;
  byte bVar65;
  
  pfVar1 = (env->active_fpu).fpr + ws;
  bVar2 = *(byte *)pfVar1;
  bVar3 = *(byte *)((long)pfVar1 + 1);
  bVar4 = *(byte *)((long)pfVar1 + 2);
  bVar5 = *(byte *)((long)pfVar1 + 3);
  bVar6 = *(byte *)((long)pfVar1 + 4);
  bVar7 = *(byte *)((long)pfVar1 + 5);
  bVar8 = *(byte *)((long)pfVar1 + 6);
  bVar9 = *(byte *)((long)pfVar1 + 7);
  bVar10 = *(byte *)((long)pfVar1 + 8);
  bVar11 = *(byte *)((long)pfVar1 + 9);
  bVar12 = *(byte *)((long)pfVar1 + 10);
  bVar13 = *(byte *)((long)pfVar1 + 0xb);
  bVar14 = *(byte *)((long)pfVar1 + 0xc);
  bVar15 = *(byte *)((long)pfVar1 + 0xd);
  bVar16 = *(byte *)((long)pfVar1 + 0xe);
  bVar17 = *(byte *)((long)pfVar1 + 0xf);
  pfVar1 = (env->active_fpu).fpr + wt;
  bVar18 = *(byte *)pfVar1;
  bVar19 = *(byte *)((long)pfVar1 + 1);
  bVar20 = *(byte *)((long)pfVar1 + 2);
  bVar21 = *(byte *)((long)pfVar1 + 3);
  bVar22 = *(byte *)((long)pfVar1 + 4);
  bVar23 = *(byte *)((long)pfVar1 + 5);
  bVar24 = *(byte *)((long)pfVar1 + 6);
  bVar25 = *(byte *)((long)pfVar1 + 7);
  bVar26 = *(byte *)((long)pfVar1 + 8);
  bVar27 = *(byte *)((long)pfVar1 + 9);
  bVar28 = *(byte *)((long)pfVar1 + 10);
  bVar29 = *(byte *)((long)pfVar1 + 0xb);
  bVar30 = *(byte *)((long)pfVar1 + 0xc);
  bVar31 = *(byte *)((long)pfVar1 + 0xd);
  bVar32 = *(byte *)((long)pfVar1 + 0xe);
  bVar33 = *(byte *)((long)pfVar1 + 0xf);
  bVar34 = -bVar2;
  bVar35 = -bVar3;
  bVar36 = -bVar4;
  bVar37 = -bVar5;
  bVar38 = -bVar6;
  bVar39 = -bVar7;
  bVar40 = -bVar8;
  bVar41 = -bVar9;
  bVar42 = -bVar10;
  bVar43 = -bVar11;
  bVar44 = -bVar12;
  bVar45 = -bVar13;
  bVar46 = -bVar14;
  bVar47 = -bVar15;
  bVar48 = -bVar16;
  bVar49 = -bVar17;
  bVar50 = (bVar2 < bVar34) * bVar2 | (bVar2 >= bVar34) * bVar34;
  bVar51 = (bVar3 < bVar35) * bVar3 | (bVar3 >= bVar35) * bVar35;
  bVar52 = (bVar4 < bVar36) * bVar4 | (bVar4 >= bVar36) * bVar36;
  bVar53 = (bVar5 < bVar37) * bVar5 | (bVar5 >= bVar37) * bVar37;
  bVar54 = (bVar6 < bVar38) * bVar6 | (bVar6 >= bVar38) * bVar38;
  bVar55 = (bVar7 < bVar39) * bVar7 | (bVar7 >= bVar39) * bVar39;
  bVar56 = (bVar8 < bVar40) * bVar8 | (bVar8 >= bVar40) * bVar40;
  bVar57 = (bVar9 < bVar41) * bVar9 | (bVar9 >= bVar41) * bVar41;
  bVar58 = (bVar10 < bVar42) * bVar10 | (bVar10 >= bVar42) * bVar42;
  bVar59 = (bVar11 < bVar43) * bVar11 | (bVar11 >= bVar43) * bVar43;
  bVar60 = (bVar12 < bVar44) * bVar12 | (bVar12 >= bVar44) * bVar44;
  bVar61 = (bVar13 < bVar45) * bVar13 | (bVar13 >= bVar45) * bVar45;
  bVar62 = (bVar14 < bVar46) * bVar14 | (bVar14 >= bVar46) * bVar46;
  bVar63 = (bVar15 < bVar47) * bVar15 | (bVar15 >= bVar47) * bVar47;
  bVar64 = (bVar16 < bVar48) * bVar16 | (bVar16 >= bVar48) * bVar48;
  bVar65 = (bVar17 < bVar49) * bVar17 | (bVar17 >= bVar49) * bVar49;
  bVar34 = -bVar18;
  bVar35 = -bVar19;
  bVar36 = -bVar20;
  bVar37 = -bVar21;
  bVar38 = -bVar22;
  bVar39 = -bVar23;
  bVar40 = -bVar24;
  bVar41 = -bVar25;
  bVar42 = -bVar26;
  bVar43 = -bVar27;
  bVar44 = -bVar28;
  bVar45 = -bVar29;
  bVar46 = -bVar30;
  bVar47 = -bVar31;
  bVar48 = -bVar32;
  bVar49 = -bVar33;
  bVar34 = (bVar18 < bVar34) * bVar18 | (bVar18 >= bVar34) * bVar34;
  bVar35 = (bVar19 < bVar35) * bVar19 | (bVar19 >= bVar35) * bVar35;
  bVar36 = (bVar20 < bVar36) * bVar20 | (bVar20 >= bVar36) * bVar36;
  bVar37 = (bVar21 < bVar37) * bVar21 | (bVar21 >= bVar37) * bVar37;
  bVar38 = (bVar22 < bVar38) * bVar22 | (bVar22 >= bVar38) * bVar38;
  bVar39 = (bVar23 < bVar39) * bVar23 | (bVar23 >= bVar39) * bVar39;
  bVar40 = (bVar24 < bVar40) * bVar24 | (bVar24 >= bVar40) * bVar40;
  bVar41 = (bVar25 < bVar41) * bVar25 | (bVar25 >= bVar41) * bVar41;
  bVar42 = (bVar26 < bVar42) * bVar26 | (bVar26 >= bVar42) * bVar42;
  bVar43 = (bVar27 < bVar43) * bVar27 | (bVar27 >= bVar43) * bVar43;
  bVar44 = (bVar28 < bVar44) * bVar28 | (bVar28 >= bVar44) * bVar44;
  bVar45 = (bVar29 < bVar45) * bVar29 | (bVar29 >= bVar45) * bVar45;
  bVar46 = (bVar30 < bVar46) * bVar30 | (bVar30 >= bVar46) * bVar46;
  bVar47 = (bVar31 < bVar47) * bVar31 | (bVar31 >= bVar47) * bVar47;
  bVar48 = (bVar32 < bVar48) * bVar32 | (bVar32 >= bVar48) * bVar48;
  bVar49 = (bVar33 < bVar49) * bVar33 | (bVar33 >= bVar49) * bVar49;
  bVar34 = -((byte)((bVar34 < bVar50) * bVar34 | (bVar34 >= bVar50) * bVar50) == bVar34);
  bVar35 = -((byte)((bVar35 < bVar51) * bVar35 | (bVar35 >= bVar51) * bVar51) == bVar35);
  bVar36 = -((byte)((bVar36 < bVar52) * bVar36 | (bVar36 >= bVar52) * bVar52) == bVar36);
  bVar37 = -((byte)((bVar37 < bVar53) * bVar37 | (bVar37 >= bVar53) * bVar53) == bVar37);
  bVar38 = -((byte)((bVar38 < bVar54) * bVar38 | (bVar38 >= bVar54) * bVar54) == bVar38);
  bVar39 = -((byte)((bVar39 < bVar55) * bVar39 | (bVar39 >= bVar55) * bVar55) == bVar39);
  bVar40 = -((byte)((bVar40 < bVar56) * bVar40 | (bVar40 >= bVar56) * bVar56) == bVar40);
  bVar41 = -((byte)((bVar41 < bVar57) * bVar41 | (bVar41 >= bVar57) * bVar57) == bVar41);
  bVar42 = -((byte)((bVar42 < bVar58) * bVar42 | (bVar42 >= bVar58) * bVar58) == bVar42);
  bVar43 = -((byte)((bVar43 < bVar59) * bVar43 | (bVar43 >= bVar59) * bVar59) == bVar43);
  bVar44 = -((byte)((bVar44 < bVar60) * bVar44 | (bVar44 >= bVar60) * bVar60) == bVar44);
  bVar45 = -((byte)((bVar45 < bVar61) * bVar45 | (bVar45 >= bVar61) * bVar61) == bVar45);
  bVar46 = -((byte)((bVar46 < bVar62) * bVar46 | (bVar46 >= bVar62) * bVar62) == bVar46);
  bVar47 = -((byte)((bVar47 < bVar63) * bVar47 | (bVar47 >= bVar63) * bVar63) == bVar47);
  bVar48 = -((byte)((bVar48 < bVar64) * bVar48 | (bVar48 >= bVar64) * bVar64) == bVar48);
  bVar49 = -((byte)((bVar49 < bVar65) * bVar49 | (bVar49 >= bVar65) * bVar65) == bVar49);
  pfVar1 = (env->active_fpu).fpr + wd;
  *(byte *)pfVar1 = ~bVar34 & bVar2 | bVar18 & bVar34;
  *(byte *)((long)pfVar1 + 1) = ~bVar35 & bVar3 | bVar19 & bVar35;
  *(byte *)((long)pfVar1 + 2) = ~bVar36 & bVar4 | bVar20 & bVar36;
  *(byte *)((long)pfVar1 + 3) = ~bVar37 & bVar5 | bVar21 & bVar37;
  *(byte *)((long)pfVar1 + 4) = ~bVar38 & bVar6 | bVar22 & bVar38;
  *(byte *)((long)pfVar1 + 5) = ~bVar39 & bVar7 | bVar23 & bVar39;
  *(byte *)((long)pfVar1 + 6) = ~bVar40 & bVar8 | bVar24 & bVar40;
  *(byte *)((long)pfVar1 + 7) = ~bVar41 & bVar9 | bVar25 & bVar41;
  *(byte *)((long)pfVar1 + 8) = ~bVar42 & bVar10 | bVar26 & bVar42;
  *(byte *)((long)pfVar1 + 9) = ~bVar43 & bVar11 | bVar27 & bVar43;
  *(byte *)((long)pfVar1 + 10) = ~bVar44 & bVar12 | bVar28 & bVar44;
  *(byte *)((long)pfVar1 + 0xb) = ~bVar45 & bVar13 | bVar29 & bVar45;
  *(byte *)((long)pfVar1 + 0xc) = ~bVar46 & bVar14 | bVar30 & bVar46;
  *(byte *)((long)pfVar1 + 0xd) = ~bVar47 & bVar15 | bVar31 & bVar47;
  *(byte *)((long)pfVar1 + 0xe) = ~bVar48 & bVar16 | bVar32 & bVar48;
  *(byte *)((long)pfVar1 + 0xf) = ~bVar49 & bVar17 | bVar33 & bVar49;
  return;
}

Assistant:

void helper_msa_min_a_b(CPUMIPSState *env,
                        uint32_t wd, uint32_t ws, uint32_t wt)
{
    wr_t *pwd = &(env->active_fpu.fpr[wd].wr);
    wr_t *pws = &(env->active_fpu.fpr[ws].wr);
    wr_t *pwt = &(env->active_fpu.fpr[wt].wr);

    pwd->b[0]  = msa_min_a_df(DF_BYTE, pws->b[0],  pwt->b[0]);
    pwd->b[1]  = msa_min_a_df(DF_BYTE, pws->b[1],  pwt->b[1]);
    pwd->b[2]  = msa_min_a_df(DF_BYTE, pws->b[2],  pwt->b[2]);
    pwd->b[3]  = msa_min_a_df(DF_BYTE, pws->b[3],  pwt->b[3]);
    pwd->b[4]  = msa_min_a_df(DF_BYTE, pws->b[4],  pwt->b[4]);
    pwd->b[5]  = msa_min_a_df(DF_BYTE, pws->b[5],  pwt->b[5]);
    pwd->b[6]  = msa_min_a_df(DF_BYTE, pws->b[6],  pwt->b[6]);
    pwd->b[7]  = msa_min_a_df(DF_BYTE, pws->b[7],  pwt->b[7]);
    pwd->b[8]  = msa_min_a_df(DF_BYTE, pws->b[8],  pwt->b[8]);
    pwd->b[9]  = msa_min_a_df(DF_BYTE, pws->b[9],  pwt->b[9]);
    pwd->b[10] = msa_min_a_df(DF_BYTE, pws->b[10], pwt->b[10]);
    pwd->b[11] = msa_min_a_df(DF_BYTE, pws->b[11], pwt->b[11]);
    pwd->b[12] = msa_min_a_df(DF_BYTE, pws->b[12], pwt->b[12]);
    pwd->b[13] = msa_min_a_df(DF_BYTE, pws->b[13], pwt->b[13]);
    pwd->b[14] = msa_min_a_df(DF_BYTE, pws->b[14], pwt->b[14]);
    pwd->b[15] = msa_min_a_df(DF_BYTE, pws->b[15], pwt->b[15]);
}